

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O3

void __thiscall
solitaire::piles::FoundationPileWithTwoTest::FoundationPileWithTwoTest
          (FoundationPileWithTwoTest *this)

{
  optional<solitaire::cards::Card> cardToAdd;
  Card local_20;
  undefined1 local_18;
  
  FoundationPileWithAceTest::FoundationPileWithAceTest(&this->super_FoundationPileWithAceTest);
  (this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FoundationPileWithAceTest_0032b2d8;
  solitaire::cards::Card::Card(&local_20,Two,Heart);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::
  emplace_back<solitaire::cards::Card>(&(this->super_FoundationPileWithAceTest).pileCards,&local_20)
  ;
  local_20 = (this->super_FoundationPileWithAceTest).pileCards.
             super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
  local_18 = 1;
  (*(((this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.pile.
      super___shared_ptr<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_FoundationPile).super_Archiver._vptr_Archiver[4])();
  return;
}

Assistant:

FoundationPileWithTwoTest() {
        pileCards.push_back(Card {Value::Two, Suit::Heart});

        std::optional<Card> cardToAdd = pileCards.back();
        pile->tryAddCard(cardToAdd);
    }